

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O2

void __thiscall ODDLParser::Value::dump(Value *this,IOStreamBase *param_1)

{
  int8 iVar1;
  int16 iVar2;
  int32 iVar3;
  ostream *poVar4;
  char *pcVar5;
  float fVar6;
  double dVar7;
  
  switch(this->m_type) {
  case ddl_bool:
    getBool(this);
    poVar4 = std::ostream::_M_insert<bool>(true);
    break;
  case ddl_int8:
    iVar1 = getInt8(this);
    poVar4 = std::operator<<((ostream *)&std::cout,iVar1);
    break;
  case ddl_int16:
    iVar2 = getInt16(this);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
    break;
  case ddl_int32:
    iVar3 = getInt32(this);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
    break;
  case ddl_int64:
    getInt64(this);
    poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
    break;
  case ddl_unsigned_int8:
  case ddl_unsigned_int16:
  case ddl_unsigned_int32:
  case ddl_unsigned_int64:
  case ddl_half:
  case ddl_ref:
    pcVar5 = "Not supported";
    goto LAB_0058f572;
  case ddl_float:
    fVar6 = getFloat(this);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,fVar6);
    break;
  case ddl_double:
    dVar7 = getDouble(this);
    poVar4 = std::ostream::_M_insert<double>(dVar7);
    break;
  case ddl_string:
    pcVar5 = getString(this);
LAB_0058f572:
    poVar4 = std::operator<<((ostream *)&std::cout,pcVar5);
    break;
  case ddl_none:
    pcVar5 = "None";
    goto LAB_0058f572;
  default:
    return;
  }
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void Value::dump( IOStreamBase &/*stream*/ ) {
    switch( m_type ) {
        case ddl_none:
            std::cout << "None" << std::endl;
            break;
        case ddl_bool:
            std::cout << getBool() << std::endl;
            break;
        case ddl_int8:
            std::cout << getInt8() << std::endl;
            break;
        case ddl_int16:
            std::cout << getInt16() << std::endl;
            break;
        case ddl_int32:
            std::cout << getInt32() << std::endl;
            break;
        case ddl_int64:
            std::cout << getInt64() << std::endl;
            break;
        case ddl_unsigned_int8:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_unsigned_int16:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_unsigned_int32:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_unsigned_int64:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_half:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_float:
            std::cout << getFloat() << std::endl;
            break;
        case ddl_double:
            std::cout << getDouble() << std::endl;
            break;
        case ddl_string:
            std::cout << getString() << std::endl;
            break;
        case ddl_ref:
            std::cout << "Not supported" << std::endl;
            break;
        default:
            break;
    }
}